

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl-ncurses.cpp
# Opt level: O0

void updateRequests_impl(void)

{
  size_type sVar1;
  reference pvVar2;
  string *psVar3;
  size_type sVar4;
  reference pvVar5;
  bool bVar6;
  type uri;
  int idx;
  int still_alive;
  CURL *e;
  Data *data;
  int msgs_left;
  CURLMsg *msg;
  size_type in_stack_ffffffffffffff78;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  CURLM *in_stack_ffffffffffffffb0;
  string local_48 [32];
  int local_28;
  int local_24;
  undefined8 local_20;
  long local_18;
  undefined4 local_c;
  uint *local_8;
  
  local_c = 0xffffffff;
  while (local_8 = (uint *)curl_multi_info_read(g_cm,&local_c), local_8 != (uint *)0x0) {
    if (*local_8 == 1) {
      local_20 = *(undefined8 *)(local_8 + 2);
      curl_easy_getinfo(*(undefined8 *)(local_8 + 2),0x100015,&local_18);
      *(undefined1 *)(local_18 + 8) = 0;
      curl_multi_remove_handle(g_cm,local_20);
    }
    else {
      fprintf(_stderr,"E: CURLMsg (%d)\n",(ulong)*local_8);
    }
  }
  local_24 = 1;
  curl_multi_perform(g_cm,&local_24);
  do {
    bVar6 = false;
    if (local_24 < 5) {
      sVar1 = std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x11e32e);
      bVar6 = sVar1 != 0;
    }
    if (!bVar6) {
      return;
    }
    local_28 = 0;
    do {
      pvVar2 = std::array<Data,_5UL>::operator[]
                         ((array<Data,_5UL> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if ((pvVar2->running & 1U) == 0) break;
      local_28 = local_28 + 1;
      in_stack_ffffffffffffffa0 = (string *)(long)local_28;
      psVar3 = (string *)std::array<Data,_5UL>::size(&g_fetchData);
    } while (in_stack_ffffffffffffffa0 != psVar3);
    sVar1 = (size_type)local_28;
    sVar4 = std::array<Data,_5UL>::size(&g_fetchData);
    if (sVar1 == sVar4) {
      return;
    }
    in_stack_ffffffffffffff80 = &g_fetchQueue_abi_cxx11_;
    pvVar5 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 = local_48;
    std::__cxx11::string::string(in_stack_ffffffffffffff90,(string *)pvVar5);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(in_stack_ffffffffffffff80);
    g_nFetches = g_nFetches + 1;
    pvVar2 = std::array<Data,_5UL>::operator[]
                       ((array<Data,_5UL> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pvVar2->running = true;
    pvVar2 = std::array<Data,_5UL>::operator[]
                       ((array<Data,_5UL> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::operator=((string *)&pvVar2->uri,in_stack_ffffffffffffff90);
    addTransfer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    local_24 = local_24 + 1;
    std::__cxx11::string::~string(local_48);
  } while( true );
}

Assistant:

void updateRequests_impl() {
    CURLMsg *msg;
    int msgs_left = -1;

    while ((msg = curl_multi_info_read(g_cm, &msgs_left))) {
        if (msg->msg == CURLMSG_DONE) {
            Data* data;
            CURL *e = msg->easy_handle;
            curl_easy_getinfo(msg->easy_handle, CURLINFO_PRIVATE, &data);
            data->running = false;
            curl_multi_remove_handle(g_cm, e);
            //curl_easy_cleanup(e);
            //data->eh = NULL;
        } else {
            fprintf(stderr, "E: CURLMsg (%d)\n", msg->msg);
        }
    }

    int still_alive = 1;

    curl_multi_perform(g_cm, &still_alive);

    while (still_alive < MAX_PARALLEL && g_fetchQueue.size() > 0) {
        int idx = 0;
        while (g_fetchData[idx].running) {
            ++idx;
            if (idx == g_fetchData.size()) break;
        }
        if (idx == g_fetchData.size()) break;

        auto uri = std::move(g_fetchQueue.front());
        g_fetchQueue.pop_front();

#ifdef ENABLE_API_CACHE
        auto fname = ::getCacheFname(uri);

        std::ifstream fin(fname);
        if (fin.is_open() && fin.good()) {
            std::string str((std::istreambuf_iterator<char>(fin)), std::istreambuf_iterator<char>());
            fin.close();

            g_fetchCache[uri] = std::move(str);

            continue;
        }
#endif

        ++g_nFetches;

        g_fetchData[idx].running = true;
        g_fetchData[idx].uri = uri;
        addTransfer(g_cm, idx, std::move(uri));

        ++still_alive;
    }
}